

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  CppType CVar4;
  FastFieldValuePrinter *pFVar5;
  Message *message_00;
  ulong uVar6;
  int j;
  char *pcVar7;
  ulong uVar8;
  uint local_c4;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  DynamicMessageFactory factory;
  
  if ((((this->use_short_repeated_primitives_ == true) && (*(int *)(field + 0x3c) == 3)) &&
      (CVar4 = FieldDescriptor::cpp_type(field), CVar4 != CPPTYPE_STRING)) &&
     (CVar4 = FieldDescriptor::cpp_type(field), CVar4 != CPPTYPE_MESSAGE)) {
    PrintShortRepeatedField(this,message,reflection,field,generator);
    return;
  }
  if (*(int *)(field + 0x3c) == 3) {
    local_c4 = Reflection::FieldSize(reflection,message,field);
  }
  else {
    bVar2 = Reflection::HasField(reflection,message,field);
    if ((bVar2) ||
       (local_c4 = 0, *(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\x01')) {
      local_c4 = 1;
    }
  }
  DynamicMessageFactory::DynamicMessageFactory(&factory);
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = FieldDescriptor::is_map(field);
  uVar8 = 0;
  bVar3 = false;
  if (bVar2) {
    bVar3 = internal::MapFieldPrinterHelper::SortMap
                      (message,reflection,field,&factory.super_MessageFactory,&sorted_map_field);
  }
  uVar6 = 0;
  if (0 < (int)local_c4) {
    uVar6 = (ulong)local_c4;
  }
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    uVar1 = 0xffffffffffffffff;
    if (*(int *)(field + 0x3c) == 3) {
      uVar1 = uVar8;
    }
    PrintFieldName(this,message,(int)uVar1,local_c4,reflection,field,generator);
    CVar4 = FieldDescriptor::cpp_type(field);
    if (CVar4 == CPPTYPE_MESSAGE) {
      pFVar5 = GetFieldPrinter(this,field);
      if (*(int *)(field + 0x3c) == 3) {
        if (bVar2) {
          message_00 = sorted_map_field.
                       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8];
        }
        else {
          message_00 = Reflection::GetRepeatedMessage(reflection,message,field,(int)uVar8);
        }
      }
      else {
        message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
      }
      (*pFVar5->_vptr_FastFieldValuePrinter[0xe])
                (pFVar5,message_00,uVar1 & 0xffffffff,(ulong)local_c4,(ulong)this->single_line_mode_
                 ,generator);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
      Print(this,message_00,generator);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
      (*pFVar5->_vptr_FastFieldValuePrinter[0xf])
                (pFVar5,message_00,uVar1 & 0xffffffff,(ulong)local_c4,(ulong)this->single_line_mode_
                 ,generator);
    }
    else {
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
      PrintFieldValue(this,message,reflection,field,(int)uVar1,generator);
      pcVar7 = "\n";
      if (this->single_line_mode_ != false) {
        pcVar7 = " ";
      }
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,pcVar7,1);
    }
  }
  if (bVar3 != false) {
    for (uVar8 = 0;
        uVar8 < (ulong)((long)sorted_map_field.
                              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)sorted_map_field.
                              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
      if (sorted_map_field.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar8] != (Message *)0x0) {
        (*(sorted_map_field.
           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar8]->super_MessageLite)._vptr_MessageLite[1]
        )();
      }
    }
  }
  std::
  _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~_Vector_base(&sorted_map_field.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                 );
  DynamicMessageFactory::~DynamicMessageFactory(&factory);
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  DynamicMessageFactory factory;
  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &factory, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      Print(sub_message, generator);
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintLiteral(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (int j = 0; j < sorted_map_field.size(); ++j) {
      delete sorted_map_field[j];
    }
  }
}